

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::TimePointToString_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,TimePoint *aTimePoint)

{
  _Put_time<char> __f;
  stringstream local_1e0 [8];
  stringstream ss;
  basic_ostream<char,_std::char_traits<char>_> local_1d0 [376];
  time_t local_58;
  time_t time;
  tm localTime;
  TimePoint *aTimePoint_local;
  
  localTime.tm_zone = (char *)this;
  local_58 = std::chrono::_V2::system_clock::to_time_t((time_point *)this);
  std::__cxx11::stringstream::stringstream(local_1e0);
  localtime_r(&local_58,(tm *)&time);
  __f = std::put_time<char>((tm *)&time,"%Y-%m-%d %H:%M:%S");
  std::operator<<(local_1d0,__f);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string TimePointToString(const TimePoint &aTimePoint)
{
    struct tm         localTime;
    std::time_t       time = Clock::to_time_t(aTimePoint);
    std::stringstream ss;

    localtime_r(&time, &localTime);
    ss << std::put_time(&localTime, "%Y-%m-%d %H:%M:%S");
    return ss.str();
}